

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoBinop<long,long>(Thread *this,BinopTrapFunc<long,_long> *f,Ptr *out_trap)

{
  RunResult RVar1;
  Value VVar2;
  Value VVar3;
  long out;
  string msg;
  ulong local_50;
  string local_48;
  
  VVar2 = Pop(this);
  VVar3 = Pop(this);
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  RVar1 = (*f)(VVar3.field_0.i64_,VVar2.field_0.i64_,(long *)&local_50,&local_48);
  if (RVar1 == Trap) {
    DoBinop<long,long>();
    RVar1 = Trap;
  }
  else {
    RVar1 = Ok;
    VVar2.field_0._8_8_ = 0;
    VVar2.field_0.i64_ = local_50;
    Push(this,VVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return RVar1;
}

Assistant:

RunResult Thread::DoBinop(BinopTrapFunc<R, T> f, Trap::Ptr* out_trap) {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  T out;
  std::string msg;
  TRAP_IF(f(lhs, rhs, &out, &msg) == RunResult::Trap, msg);
  Push<R>(out);
  return RunResult::Ok;
}